

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O2

void get_pointer(t_get *x,t_gpointer *gp)

{
  char cVar1;
  t_gstub *ptVar2;
  int iVar3;
  int iVar4;
  t_symbol *s;
  t_symbol *ptVar5;
  t_template *x_00;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  t_getvariable *ptVar9;
  char *fmt;
  ulong uVar10;
  bool bVar11;
  int onset;
  int type;
  long local_40;
  t_symbol *arraytype;
  
  iVar4 = x->x_nout;
  ptVar2 = gp->gp_stub;
  iVar3 = gpointer_check(gp,0);
  if (iVar3 == 0) {
    pd_error(x,"get: stale or empty pointer");
    return;
  }
  ptVar5 = x->x_templatesym;
  cVar1 = *ptVar5->s_name;
  s = gpointer_gettemplatesym(gp);
  if ((cVar1 != '\0') && (bVar11 = ptVar5 != s, s = ptVar5, bVar11)) {
    pcVar8 = ptVar5->s_name;
    ptVar5 = gpointer_gettemplatesym(gp);
    pd_error(x,"get %s: got wrong template (%s)",pcVar8,ptVar5->s_name);
    return;
  }
  x_00 = template_findbyname(s);
  if (x_00 == (t_template *)0x0) {
    pd_error(x,"get: couldn\'t find template %s",s->s_name);
    return;
  }
  lVar6 = 0x18;
  if (ptVar2->gs_which == 2) {
    lVar6 = 0;
  }
  local_40 = (long)((gp->gp_un).gp_scalar)->sc_vec + lVar6 + -0x18;
  uVar10 = (long)iVar4 - 1;
  ptVar9 = x->x_variables + uVar10;
  do {
    if ((int)uVar10 < 0) {
      return;
    }
    iVar4 = template_find_field(x_00,ptVar9->gv_sym,&onset,&type,&arraytype);
    if (iVar4 == 0) {
      pcVar8 = x_00->t_sym->s_name;
      pcVar7 = ptVar9->gv_sym->s_name;
      fmt = "get: %s.%s: no such field";
LAB_0015e587:
      pd_error(x,fmt,pcVar8,pcVar7);
    }
    else if (type == 1) {
      outlet_symbol(ptVar9->gv_outlet,*(t_symbol **)(local_40 + onset));
    }
    else {
      if (type != 0) {
        pcVar8 = x_00->t_sym->s_name;
        pcVar7 = ptVar9->gv_sym->s_name;
        fmt = "get: %s.%s is not a number or symbol";
        goto LAB_0015e587;
      }
      outlet_float(ptVar9->gv_outlet,*(t_float *)(local_40 + onset));
    }
    uVar10 = (ulong)((int)uVar10 - 1);
    ptVar9 = ptVar9 + -1;
  } while( true );
}

Assistant:

static void get_pointer(t_get *x, t_gpointer *gp)
{
    int nitems = x->x_nout, i;
    t_symbol *templatesym;
    t_template *template;
    t_gstub *gs = gp->gp_stub;
    t_word *vec;
    t_getvariable *vp;

    if (!gpointer_check(gp, 0))
    {
        pd_error(x, "get: stale or empty pointer");
        return;
    }
    if (*x->x_templatesym->s_name)
    {
        if ((templatesym = x->x_templatesym) != gpointer_gettemplatesym(gp))
        {
            pd_error(x, "get %s: got wrong template (%s)",
                templatesym->s_name, gpointer_gettemplatesym(gp)->s_name);
            return;
        }
    }
    else templatesym = gpointer_gettemplatesym(gp);
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "get: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (gs->gs_which == GP_ARRAY) vec = gp->gp_un.gp_w;
    else vec = gp->gp_un.gp_scalar->sc_vec;
    for (i = nitems - 1, vp = x->x_variables + i; i >= 0; i--, vp--)
    {
        int onset, type;
        t_symbol *arraytype;
        if (template_find_field(template, vp->gv_sym, &onset, &type, &arraytype))
        {
            if (type == DT_FLOAT)
                outlet_float(vp->gv_outlet,
                    *(t_float *)(((char *)vec) + onset));
            else if (type == DT_SYMBOL)
                outlet_symbol(vp->gv_outlet,
                    *(t_symbol **)(((char *)vec) + onset));
            else pd_error(x, "get: %s.%s is not a number or symbol",
                    template->t_sym->s_name, vp->gv_sym->s_name);
        }
        else pd_error(x, "get: %s.%s: no such field",
            template->t_sym->s_name, vp->gv_sym->s_name);
    }
}